

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::NeuralNetworkClassifier::MergeFrom
          (NeuralNetworkClassifier *this,NeuralNetworkClassifier *from)

{
  void *pvVar1;
  ArenaStringPtr value;
  LogMessage *other;
  NetworkUpdateParameters *this_00;
  StringVector *this_01;
  StringVector *from_00;
  Int64Vector *this_02;
  Int64Vector *from_01;
  NetworkUpdateParameters *from_02;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O2/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x1158b);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
            (&(this->layers_).super_RepeatedPtrFieldBase,&(from->layers_).super_RepeatedPtrFieldBase
            );
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkPreprocessing>::TypeHandler>
            (&(this->preprocessing_).super_RepeatedPtrFieldBase,
             &(from->preprocessing_).super_RepeatedPtrFieldBase);
  value.ptr_ = (from->labelprobabilitylayername_).ptr_;
  if ((value.ptr_)->_M_string_length != 0) {
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->labelprobabilitylayername_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,value);
  }
  if ((from != (NeuralNetworkClassifier *)&_NeuralNetworkClassifier_default_instance_) &&
     (from->updateparams_ != (NetworkUpdateParameters *)0x0)) {
    this_00 = mutable_updateparams(this);
    from_02 = from->updateparams_;
    if (from_02 == (NetworkUpdateParameters *)0x0) {
      from_02 = (NetworkUpdateParameters *)&_NetworkUpdateParameters_default_instance_;
    }
    NetworkUpdateParameters::MergeFrom(this_00,from_02);
  }
  if (from->arrayinputshapemapping_ != 0) {
    this->arrayinputshapemapping_ = from->arrayinputshapemapping_;
  }
  if (from->imageinputshapemapping_ != 0) {
    this->imageinputshapemapping_ = from->imageinputshapemapping_;
  }
  if (from->_oneof_case_[0] == 0x65) {
    this_02 = mutable_int64classlabels(this);
    from_01 = int64classlabels(from);
    Int64Vector::MergeFrom(this_02,from_01);
  }
  else if (from->_oneof_case_[0] == 100) {
    this_01 = mutable_stringclasslabels(this);
    from_00 = stringclasslabels(from);
    StringVector::MergeFrom(this_01,from_00);
  }
  return;
}

Assistant:

void NeuralNetworkClassifier::MergeFrom(const NeuralNetworkClassifier& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.NeuralNetworkClassifier)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  layers_.MergeFrom(from.layers_);
  preprocessing_.MergeFrom(from.preprocessing_);
  if (from.labelprobabilitylayername().size() > 0) {

    labelprobabilitylayername_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.labelprobabilitylayername_);
  }
  if (from.has_updateparams()) {
    mutable_updateparams()->::CoreML::Specification::NetworkUpdateParameters::MergeFrom(from.updateparams());
  }
  if (from.arrayinputshapemapping() != 0) {
    set_arrayinputshapemapping(from.arrayinputshapemapping());
  }
  if (from.imageinputshapemapping() != 0) {
    set_imageinputshapemapping(from.imageinputshapemapping());
  }
  switch (from.ClassLabels_case()) {
    case kStringClassLabels: {
      mutable_stringclasslabels()->::CoreML::Specification::StringVector::MergeFrom(from.stringclasslabels());
      break;
    }
    case kInt64ClassLabels: {
      mutable_int64classlabels()->::CoreML::Specification::Int64Vector::MergeFrom(from.int64classlabels());
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
}